

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgParticleSwarm.hpp
# Opt level: O0

void __thiscall TasOptimization::ParticleSwarmState::clearCache(ParticleSwarmState *this)

{
  iterator iVar1;
  _Bit_iterator __first;
  _Bit_iterator __first_00;
  _Bit_iterator __last;
  _Bit_iterator __last_00;
  bool local_c9;
  _Bit_type *local_c8;
  uint local_c0;
  _Bit_type *local_b8;
  uint local_b0;
  _Bit_type *local_a8;
  uint local_a0;
  _Bit_type *local_98;
  uint local_90;
  double local_88;
  double *local_80;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_78;
  bool local_69;
  _Bit_type *local_68;
  uint local_60;
  _Bit_type *local_58;
  uint local_50;
  _Bit_type *local_48;
  uint local_40;
  _Bit_type *local_38;
  uint local_30;
  double local_28;
  double *local_20;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_18;
  ParticleSwarmState *local_10;
  ParticleSwarmState *this_local;
  
  this->cache_initialized = false;
  local_10 = this;
  local_18._M_current =
       (double *)std::vector<double,_std::allocator<double>_>::begin(&this->cache_particle_fvals);
  local_20 = (double *)
             std::vector<double,_std::allocator<double>_>::end(&this->cache_particle_fvals);
  local_28 = 0.0;
  std::fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
            (local_18,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                      local_20,&local_28);
  iVar1 = std::vector<bool,_std::allocator<bool>_>::begin(&this->cache_particle_inside);
  local_48 = iVar1.super__Bit_iterator_base._M_p;
  local_40 = iVar1.super__Bit_iterator_base._M_offset;
  local_38 = local_48;
  local_30 = local_40;
  iVar1 = std::vector<bool,_std::allocator<bool>_>::end(&this->cache_particle_inside);
  local_68 = iVar1.super__Bit_iterator_base._M_p;
  local_60 = iVar1.super__Bit_iterator_base._M_offset;
  local_69 = false;
  __first.super__Bit_iterator_base._M_offset = local_30;
  __first.super__Bit_iterator_base._M_p = local_38;
  __first.super__Bit_iterator_base._12_4_ = 0;
  __last.super__Bit_iterator_base._12_4_ = 0;
  __last.super__Bit_iterator_base._M_p =
       (_Bit_type *)SUB128(iVar1.super__Bit_iterator_base._0_12_,0);
  __last.super__Bit_iterator_base._M_offset = SUB124(iVar1.super__Bit_iterator_base._0_12_,8);
  local_58 = local_68;
  local_50 = local_60;
  std::fill<std::_Bit_iterator,bool>(__first,__last,&local_69);
  local_78._M_current =
       (double *)
       std::vector<double,_std::allocator<double>_>::begin(&this->cache_best_particle_fvals);
  local_80 = (double *)
             std::vector<double,_std::allocator<double>_>::end(&this->cache_best_particle_fvals);
  local_88 = 0.0;
  std::fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
            (local_78,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                      local_80,&local_88);
  iVar1 = std::vector<bool,_std::allocator<bool>_>::begin(&this->cache_best_particle_inside);
  local_a8 = iVar1.super__Bit_iterator_base._M_p;
  local_a0 = iVar1.super__Bit_iterator_base._M_offset;
  local_98 = local_a8;
  local_90 = local_a0;
  iVar1 = std::vector<bool,_std::allocator<bool>_>::end(&this->cache_best_particle_inside);
  local_c8 = iVar1.super__Bit_iterator_base._M_p;
  local_c0 = iVar1.super__Bit_iterator_base._M_offset;
  local_c9 = false;
  __first_00.super__Bit_iterator_base._M_offset = local_90;
  __first_00.super__Bit_iterator_base._M_p = local_98;
  __first_00.super__Bit_iterator_base._12_4_ = 0;
  __last_00.super__Bit_iterator_base._12_4_ = 0;
  __last_00.super__Bit_iterator_base._M_p =
       (_Bit_type *)SUB128(iVar1.super__Bit_iterator_base._0_12_,0);
  __last_00.super__Bit_iterator_base._M_offset = SUB124(iVar1.super__Bit_iterator_base._0_12_,8);
  local_b8 = local_c8;
  local_b0 = local_c0;
  std::fill<std::_Bit_iterator,bool>(__first_00,__last_00,&local_c9);
  return;
}

Assistant:

void clearCache() {
        cache_initialized = false;
        std::fill(cache_particle_fvals.begin(), cache_particle_fvals.end(), 0.0);
        std::fill(cache_particle_inside.begin(), cache_particle_inside.end(), false);
        std::fill(cache_best_particle_fvals.begin(), cache_best_particle_fvals.end(), 0.0);
        std::fill(cache_best_particle_inside.begin(), cache_best_particle_inside.end(), false);
    }